

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdisubwindow.cpp
# Opt level: O0

Operation __thiscall QMdiSubWindowPrivate::getOperation(QMdiSubWindowPrivate *this,QPoint *pos)

{
  long lVar1;
  bool bVar2;
  OperationInfo *pOVar3;
  ulong uVar4;
  Operation *pOVar5;
  const_iterator *in_RDI;
  long in_FS_OFFSET;
  const_iterator it;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  Operation local_24;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QMap<QMdiSubWindowPrivate::Operation,_QMdiSubWindowPrivate::OperationInfo>::const_iterator::
  const_iterator((const_iterator *)0x631b10);
  QMap<QMdiSubWindowPrivate::Operation,_QMdiSubWindowPrivate::OperationInfo>::constBegin
            ((QMap<QMdiSubWindowPrivate::Operation,_QMdiSubWindowPrivate::OperationInfo> *)
             CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
  do {
    QMap<QMdiSubWindowPrivate::Operation,_QMdiSubWindowPrivate::OperationInfo>::constEnd
              ((QMap<QMdiSubWindowPrivate::Operation,_QMdiSubWindowPrivate::OperationInfo> *)
               CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
    bVar2 = ::operator!=(in_RDI,(const_iterator *)
                                CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
    if (!bVar2) {
      local_24 = None;
LAB_00631ba4:
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        return local_24;
      }
      __stack_chk_fail();
    }
    pOVar3 = QMap<QMdiSubWindowPrivate::Operation,_QMdiSubWindowPrivate::OperationInfo>::
             const_iterator::value((const_iterator *)0x631b65);
    uVar4 = QRegion::contains((QPoint *)&pOVar3->region);
    if ((uVar4 & 1) != 0) {
      pOVar5 = QMap<QMdiSubWindowPrivate::Operation,_QMdiSubWindowPrivate::OperationInfo>::
               const_iterator::key((const_iterator *)0x631b86);
      local_24 = *pOVar5;
      goto LAB_00631ba4;
    }
    QMap<QMdiSubWindowPrivate::Operation,_QMdiSubWindowPrivate::OperationInfo>::const_iterator::
    operator++(in_RDI);
  } while( true );
}

Assistant:

QMdiSubWindowPrivate::Operation QMdiSubWindowPrivate::getOperation(const QPoint &pos) const
{
    OperationInfoMap::const_iterator it;
    for (it = operationMap.constBegin(); it != operationMap.constEnd(); ++it)
        if (it.value().region.contains(pos))
            return it.key();
    return None;
}